

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

bool __thiscall r_exec::PGMOverlay::check_guards(PGMOverlay *this)

{
  _Object *p_Var1;
  byte bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  undefined4 extraout_var;
  ushort uVar6;
  bool bVar7;
  uint16_t result_index;
  IPGMContext c;
  IPGMContext c_1;
  ushort local_a0;
  uint16_t local_9a;
  undefined8 local_98;
  IPGMContext local_90;
  IPGMContext local_60;
  
  local_98 = r_code::Atom::asIndex();
  bVar2 = r_code::Atom::getAtomCount();
  bVar7 = bVar2 == 0;
  if (!bVar7) {
    uVar6 = 1;
    do {
      sVar4 = (short)local_98;
      p_Var1 = (((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).object;
      iVar5 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
      local_90.object = (Code *)CONCAT44(extraout_var,iVar5);
      local_90.super__Context.code = (this->super_InputLessPGMOverlay).super_Overlay.code;
      local_90.view = (View *)((this->super_InputLessPGMOverlay).super_Overlay.controller)->view;
      local_90.super__Context.data = STEM;
      local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
      local_90.super__Context.overlay = (Overlay *)this;
      local_90.super__Context.index = sVar4 + uVar6;
      IPGMContext::operator*(&local_60,&local_90);
      bVar3 = IPGMContext::evaluate_no_dereference(&local_60,&local_9a);
      if (!bVar3) {
        return bVar7;
      }
      local_a0 = (ushort)bVar2;
      bVar7 = local_a0 <= uVar6;
      sVar4 = (1 - (ushort)bVar2) + uVar6;
      uVar6 = uVar6 + 1;
    } while (sVar4 != 1);
  }
  return bVar7;
}

Assistant:

bool PGMOverlay::check_guards()
{
    uint16_t guard_set_index = code[PGM_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        if (!evaluate(guard_set_index + i)) {
            return false;
        }
    }

    return true;
}